

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O3

void anon_unknown.dwarf_44b42::err_cb(exr_const_context_t f,int code,char *msg)

{
  ostream *poVar1;
  size_t sVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"err_cb ERROR ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,code);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  if (msg == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,msg,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

static void
err_cb (exr_const_context_t f, int code, const char* msg)
{
    std::cerr << "err_cb ERROR " << code << ": " << msg << std::endl;
}